

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__encode_scanline
               (stbir__info *stbir_info,void *output_buffer_data,float *encode_buffer,int row)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (stbir_info->horizontal).scale_info.output_sub_size;
  iVar2 = stbir_info->channels * iVar1;
  if ((code *)stbir_info->alpha_unweight != (code *)0x0) {
    (*(code *)stbir_info->alpha_unweight)(encode_buffer,iVar2);
  }
  if (stbir_info->out_pixels_cb != (stbir_output_callback *)0x0) {
    output_buffer_data = encode_buffer;
  }
  (*stbir_info->encode_pixels)(output_buffer_data,iVar2,encode_buffer);
  if (stbir_info->out_pixels_cb != (stbir_output_callback *)0x0) {
    (*stbir_info->out_pixels_cb)(output_buffer_data,iVar1,row,stbir_info->user_data);
    return;
  }
  return;
}

Assistant:

static void stbir__encode_scanline( stbir__info const * stbir_info, void *output_buffer_data, float * encode_buffer, int row  STBIR_ONLY_PROFILE_GET_SPLIT_INFO )
{
  int num_pixels = stbir_info->horizontal.scale_info.output_sub_size;
  int channels = stbir_info->channels;
  int width_times_channels = num_pixels * channels;
  void * output_buffer;

  // un-alpha weight if we need to
  if ( stbir_info->alpha_unweight )
  {
    STBIR_PROFILE_START( unalpha );
    stbir_info->alpha_unweight( encode_buffer, width_times_channels );
    STBIR_PROFILE_END( unalpha );
  }

  // write directly into output by default
  output_buffer = output_buffer_data;

  // if we have an output callback, we first convert the decode buffer in place (and then hand that to the callback)
  if ( stbir_info->out_pixels_cb )
    output_buffer = encode_buffer;

  STBIR_PROFILE_START( encode );
  // convert into the output buffer
  stbir_info->encode_pixels( output_buffer, width_times_channels, encode_buffer );
  STBIR_PROFILE_END( encode );

  // if we have an output callback, call it to send the data
  if ( stbir_info->out_pixels_cb )
    stbir_info->out_pixels_cb( output_buffer, num_pixels, row, stbir_info->user_data );
}